

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

void Sbd_ManCutExpand(Gia_Man_t *p,Vec_Int_t *vMirrors,Vec_Int_t *vLutLevs,Vec_Int_t *vCut)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  uint i;
  
  i = 0;
  do {
    while (vCut->nSize <= (int)i) {
LAB_0045ffdb:
      bVar1 = vCut->nSize <= (int)i;
      i = 0;
      if (bVar1) {
        return;
      }
    }
    iVar2 = Vec_IntEntry(vCut,i);
    iVar3 = Vec_IntEntry(vLutLevs,iVar2);
    pGVar9 = Gia_ManObj(p,iVar2);
    uVar4 = (uint)*(undefined8 *)pGVar9;
    if ((~uVar4 & 0x9fffffff) != 0) {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                      ,0xb2,
                      "int Sbd_ManCutExpandOne(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      iVar5 = Vec_IntEntry(vMirrors,iVar2 - (uVar4 & 0x1fffffff));
      iVar6 = Vec_IntEntry(vMirrors,iVar2 - (*(uint *)&pGVar9->field_0x4 & 0x1fffffff));
      if (iVar5 < 0) {
        iVar5 = iVar2 - (*(uint *)pGVar9 & 0x1fffffff);
      }
      else {
        iVar5 = Abc_Lit2Var(iVar5);
      }
      if (iVar6 < 0) {
        iVar2 = iVar2 - (*(uint *)&pGVar9->field_0x4 & 0x1fffffff);
      }
      else {
        iVar2 = Abc_Lit2Var(iVar6);
      }
      iVar6 = Vec_IntFind(vCut,iVar5);
      iVar7 = Vec_IntFind(vCut,iVar2);
      if ((iVar6 != -1) || (iVar7 != -1)) {
        iVar8 = Vec_IntEntry(vLutLevs,iVar5);
        if (iVar8 <= iVar3) {
          iVar8 = Vec_IntEntry(vLutLevs,iVar2);
          if (iVar8 <= iVar3) {
            if (vCut->nSize <= (int)i) {
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            iVar3 = vCut->nSize + -1;
            vCut->nSize = iVar3;
            for (uVar10 = (ulong)i; (int)uVar10 < iVar3; uVar10 = uVar10 + 1) {
              vCut->pArray[uVar10] = vCut->pArray[uVar10 + 1];
              iVar3 = vCut->nSize;
            }
            if (iVar5 != 0 && iVar6 == -1) {
              Vec_IntPushOrder(vCut,iVar5);
            }
            if (iVar2 != 0 && iVar7 == -1) {
              Vec_IntPushOrder(vCut,iVar2);
            }
            goto LAB_0045ffdb;
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Sbd_ManCutExpand( Gia_Man_t * p, Vec_Int_t * vMirrors, Vec_Int_t * vLutLevs, Vec_Int_t * vCut )
{
    int i, Entry;
    do
    {
        Vec_IntForEachEntry( vCut, Entry, i )
            if ( Sbd_ManCutExpandOne( p, vMirrors, vLutLevs, vCut, i, Entry ) )
                break;
    } 
    while ( i < Vec_IntSize(vCut) );
}